

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

bool __thiscall
QGraphicsItemPrivate::discardUpdateRequest
          (QGraphicsItemPrivate *this,bool ignoreVisibleBit,bool ignoreDirtyBit,bool ignoreOpacity)

{
  ulong uVar1;
  QGraphicsItem **ppQVar2;
  QGraphicsItemPrivate *pQVar3;
  ulong uVar4;
  QGraphicsItem *p;
  QGraphicsItem *pQVar5;
  ulong uVar6;
  ulong uVar7;
  qreal o;
  double dVar8;
  
  if ((this->scene != (QGraphicsScene *)0x0) &&
     (uVar6 = *(ulong *)&this->field_0x160, (uVar6 & 0x200000000000020) != 0 || ignoreVisibleBit)) {
    if (ignoreDirtyBit) {
      if (((byte)(uVar6 >> 0x3a) & 1) != 0 || ignoreOpacity) {
        return false;
      }
    }
    else {
      if ((int)uVar6 < 0 || ignoreOpacity) {
        return (bool)((byte)(uVar6 >> 0x1f) & 1);
      }
      if ((uVar6 >> 0x3a & 1) != 0) {
        return false;
      }
    }
    uVar1 = (this->children).d.size;
    if (uVar1 != 0) {
      if ((uVar6 >> 0x27 & 1) != 0) {
        return false;
      }
      ppQVar2 = (this->children).d.ptr;
      if (((((*ppQVar2)->d_ptr).d)->field_0x164 & 0x40) != 0) {
        return false;
      }
      uVar4 = 1;
      do {
        uVar7 = uVar4;
        if (uVar1 == uVar7) break;
        uVar4 = uVar7 + 1;
      } while ((*(ulong *)&((ppQVar2[uVar7]->d_ptr).d)->field_0x160 & 0x4000000000) == 0);
      if (uVar7 < uVar1) {
        return false;
      }
    }
    dVar8 = this->opacity;
    if (0.001 <= dVar8) {
      pQVar5 = this->parent;
      if (pQVar5 == (QGraphicsItem *)0x0) {
        return false;
      }
      uVar6 = uVar6 >> 0x20;
      while (pQVar5 != (QGraphicsItem *)0x0) {
        pQVar3 = (pQVar5->d_ptr).d;
        if ((*(uint *)&pQVar3->field_0x164 & 0x80) != 0 || (uVar6 & 0x40) != 0) break;
        dVar8 = dVar8 * pQVar3->opacity;
        uVar6 = (ulong)*(uint *)&pQVar3->field_0x164;
        pQVar5 = pQVar3->parent;
      }
      return dVar8 < 0.001;
    }
  }
  return true;
}

Assistant:

bool QGraphicsItemPrivate::discardUpdateRequest(bool ignoreVisibleBit, bool ignoreDirtyBit,
                                                bool ignoreOpacity) const
{
    // No scene, or if the scene is updating everything, means we have nothing
    // to do. The only exception is if the scene tracks the growing scene rect.
    return !scene
           || (!visible && !ignoreVisibleBit && !this->ignoreVisible)
           || (!ignoreDirtyBit && fullUpdatePending)
           || (!ignoreOpacity && !this->ignoreOpacity && childrenCombineOpacity() && isFullyTransparent());
}